

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testVec.cpp
# Opt level: O0

void anon_unknown.dwarf_b0d76::testLength3T<double>(void)

{
  bool bVar1;
  double dVar2;
  Vec3<double> *this;
  Vec3<double> *this_00;
  double t;
  Vec3<double> v;
  double e;
  double s;
  undefined4 in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  double in_stack_fffffffffffffc60;
  Vec3<double> *in_stack_fffffffffffffc68;
  Vec3<double> *in_stack_fffffffffffffc78;
  Vec3<double> local_348 [2];
  Vec3<double> local_318 [2];
  Vec3<double> local_2e8 [2];
  Vec3<double> local_2b8 [2];
  Vec3<double> local_288 [2];
  Vec3<double> local_258 [2];
  Vec3<double> local_228 [2];
  Vec3<double> local_1f8 [2];
  Vec3<double> local_1c8 [2];
  Vec3<double> local_198 [2];
  Vec3<double> local_168 [2];
  Vec3<double> local_138;
  double local_120;
  Vec3<double> local_100 [2];
  Vec3<double> local_d0 [2];
  Vec3<double> local_a0 [2];
  Vec3<double> local_70 [2];
  Vec3<double> local_40;
  Vec3<double> local_28;
  double local_10;
  double local_8;
  
  dVar2 = std::numeric_limits<double>::min();
  local_8 = sqrt(dVar2);
  local_10 = std::numeric_limits<double>::epsilon();
  local_10 = local_10 * 4.0;
  Imath_3_2::Vec3<double>::Vec3(&local_28);
  Imath_3_2::Vec3<double>::Vec3(&local_40,0.0,0.0,0.0);
  Imath_3_2::Vec3<double>::operator=(&local_28,&local_40);
  dVar2 = Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    __assert_fail("v.length () == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x61,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  dVar2 = Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    __assert_fail("v.normalized ().length () == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x62,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_70,3.0,4.0,0.0);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_70);
  dVar2 = Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  if ((dVar2 != 5.0) || (NAN(dVar2))) {
    __assert_fail("v.length () == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x65,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.65395998008256e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x66,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_a0,3000.0,4000.0,0.0);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_a0);
  dVar2 = Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  if ((dVar2 != 5000.0) || (NAN(dVar2))) {
    __assert_fail("v.length () == 5000",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x69,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.654977755313e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x6a,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_d0,1.0,-1.0,1.0);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_d0);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  std::sqrt<int>(0);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.65574355706405e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length (), 1 * std::sqrt (3), e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x6e,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.65619315680177e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x6f,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_100,1000.0,-1000.0,1000.0);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_100);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  std::sqrt<int>(0);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.65695895855282e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal ( v.length (), 1000 * std::sqrt (3), 1000 * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x73,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.65740855829054e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x74,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  local_120 = local_8 * 16.0;
  Imath_3_2::Vec3<double>::Vec3(&local_138,local_120,0.0,0.0);
  Imath_3_2::Vec3<double>::operator=(&local_28,&local_138);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.65818918201097e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x79,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.65863878174868e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x7a,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_168,0.0,local_120,0.0);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_168);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.65929094840119e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x7c,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.65974054813891e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x7d,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_198,0.0,0.0,local_120);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_198);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.66039271479142e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x7f,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.66084231452913e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x80,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_1c8,-local_120,-local_120,-local_120);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_1c8);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  std::sqrt<int>(0);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.66209724126957e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal ( v.length (), t * std::sqrt (3), t * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x83,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.66254684100729e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x84,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  local_120 = local_8 / 16.0;
  Imath_3_2::Vec3<double>::Vec3(local_1f8,local_120,0.0,0.0);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_1f8);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.66334722735355e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x89,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.66379682709126e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x8a,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_228,0.0,local_120,0.0);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_228);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.66444899374377e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x8c,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.66489859348149e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x8d,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_258,0.0,0.0,local_120);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_258);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.665550760134e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x8f,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.66600035987172e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x90,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_288,-local_120,-local_120,-local_120);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_288);
  this = (Vec3<double> *)Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  std::sqrt<int>(0);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.66725528661215e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal ( v.length (), t * std::sqrt (3), t * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x93,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(this);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.66770488634987e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x94,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  local_120 = local_8 / 1048576.0;
  Imath_3_2::Vec3<double>::Vec3(local_2b8,local_120,0.0,0.0);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_2b8);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.66850527269613e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x99,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(this);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.66895487243385e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x9a,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_2e8,0.0,local_120,0.0);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_2e8);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.66960703908636e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x9c,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(this);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.67005663882407e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x9d,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_318,0.0,0.0,local_120);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_318);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.67070880547658e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0x9f,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(this);
  Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_3_2::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.67112876127555e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0xa0,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::Vec3(local_348,-local_120,-local_120,-local_120);
  Imath_3_2::Vec3<double>::operator=(&local_28,local_348);
  this_00 = (Vec3<double> *)Imath_3_2::Vec3<double>::length(in_stack_fffffffffffffc68);
  dVar2 = local_120;
  std::sqrt<int>(0);
  bVar1 = Imath_3_2::equal<double,double,double>
                    (dVar2,(double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.67235404407723e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal ( v.length (), t * std::sqrt (3), t * e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0xa3,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_3_2::Vec3<double>::normalized(this);
  Imath_3_2::Vec3<double>::length(this_00);
  bVar1 = Imath_3_2::equal<double,int,double>(dVar2,in_stack_fffffffffffffc5c,8.6727739998762e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testVec.cpp"
                  ,0xa4,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  return;
}

Assistant:

void
testLength3T ()
{
    const T s = std::sqrt (std::numeric_limits<T>::min ());
    const T e = 4 * std::numeric_limits<T>::epsilon ();

    Vec3<T> v;

    v = Vec3<T> (0, 0, 0);
    assert (v.length () == 0);
    assert (v.normalized ().length () == 0);

    v = Vec3<T> (3, 4, 0);
    assert (v.length () == 5);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));

    v = Vec3<T> (3000, 4000, 0);
    assert (v.length () == 5000);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));

    v = Vec3<T> (1, -1, 1);
    assert (
        IMATH_INTERNAL_NAMESPACE::equal (v.length (), 1 * std::sqrt (3), e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));

    v = Vec3<T> (1000, -1000, 1000);
    assert (IMATH_INTERNAL_NAMESPACE::equal (
        v.length (), 1000 * std::sqrt (3), 1000 * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));

    T t = s * (1 << 4);

    v = Vec3<T> (t, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));
    v = Vec3<T> (0, t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));
    v = Vec3<T> (0, 0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));
    v = Vec3<T> (-t, -t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (
        v.length (), t * std::sqrt (3), t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));

    t = s / (1 << 4);

    v = Vec3<T> (t, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));
    v = Vec3<T> (0, t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));
    v = Vec3<T> (0, 0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));
    v = Vec3<T> (-t, -t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (
        v.length (), t * std::sqrt (3), t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));

    t = s / (1 << 20);

    v = Vec3<T> (t, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));
    v = Vec3<T> (0, t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));
    v = Vec3<T> (0, 0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length (), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));
    v = Vec3<T> (-t, -t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (
        v.length (), t * std::sqrt (3), t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized ().length (), 1, e));
}